

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O2

bool __thiscall
cmWhileFunctionBlocker::ShouldRemove
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *param_2)

{
  bool bVar1;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff,
                          "endwhile");
  if (bVar1) {
    if ((lff->Arguments).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (lff->Arguments).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    bVar1 = std::operator==(&lff->Arguments,&this->Args);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool cmWhileFunctionBlocker::ShouldRemove(const cmListFileFunction& lff,
                                          cmMakefile&)
{
  if (lff.Name.Lower == "endwhile") {
    // if the endwhile has arguments, then make sure
    // they match the arguments of the matching while
    if (lff.Arguments.empty() || lff.Arguments == this->Args) {
      return true;
    }
  }
  return false;
}